

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O1

void __thiscall
lunasvg::Canvas::fillPath(Canvas *this,Path *path,FillRule fillRule,Transform *transform)

{
  undefined3 in_register_00000011;
  
  plutovg_canvas_reset_matrix(this->m_canvas);
  plutovg_canvas_translate(this->m_canvas,(float)-this->m_x,(float)-this->m_y);
  plutovg_canvas_transform(this->m_canvas,&transform->m_matrix);
  plutovg_canvas_set_fill_rule(this->m_canvas,CONCAT31(in_register_00000011,fillRule));
  plutovg_canvas_set_operator(this->m_canvas,PLUTOVG_OPERATOR_SRC_OVER);
  plutovg_canvas_fill_path(this->m_canvas,path->m_data);
  return;
}

Assistant:

void Canvas::fillPath(const Path& path, FillRule fillRule, const Transform& transform)
{
    plutovg_canvas_reset_matrix(m_canvas);
    plutovg_canvas_translate(m_canvas, -m_x, -m_y);
    plutovg_canvas_transform(m_canvas, &transform.matrix());
    plutovg_canvas_set_fill_rule(m_canvas, static_cast<plutovg_fill_rule_t>(fillRule));
    plutovg_canvas_set_operator(m_canvas, PLUTOVG_OPERATOR_SRC_OVER);
    plutovg_canvas_fill_path(m_canvas, path.data());
}